

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::BilinearPatch::CreatePatches
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
           *__return_storage_ptr__,BilinearPatchMesh *mesh,Allocator alloc)

{
  ulong uVar1;
  int iVar2;
  BilinearPatch *this;
  ulong uVar3;
  size_t n;
  long lVar4;
  BilinearPatch *pBVar5;
  BilinearPatchMesh *mesh_local;
  int vb;
  size_t va;
  undefined4 extraout_var;
  
  mesh_local = mesh;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&CreatePatches::allMeshesLock);
  if (iVar2 == 0) {
    uVar1 = allMeshes->nStored;
    vb = -0x80000000;
    va = uVar1;
    if (uVar1 < 0xffffffff80000000) {
      pstd::
      vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
      ::push_back(allMeshes,&mesh_local);
      pthread_mutex_unlock((pthread_mutex_t *)&CreatePatches::allMeshesLock);
      n = (size_t)mesh_local->nPatches;
      (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
      __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
      __return_storage_ptr__->nAlloc = 0;
      __return_storage_ptr__->nStored = 0;
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::reserve
                (__return_storage_ptr__,n);
      if (n != 0) {
        memset(__return_storage_ptr__->ptr,0,n * 8);
      }
      __return_storage_ptr__->nStored = n;
      if ((long)mesh_local->nPatches != 0) {
        iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                          (alloc.memoryResource,(long)mesh_local->nPatches * 0xc,4);
        this = (BilinearPatch *)CONCAT44(extraout_var,iVar2);
        if (0 < mesh_local->nPatches) {
          lVar4 = 0;
          pBVar5 = this;
          do {
            BilinearPatch(this,mesh_local,(int)uVar1,(int)lVar4);
            uVar3 = (ulong)pBVar5 | 0x5000000000000;
            pBVar5 = pBVar5 + 1;
            this = this + 1;
            __return_storage_ptr__->ptr[lVar4].
            super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
            .bits = uVar3;
            lVar4 = lVar4 + 1;
          } while (lVar4 < mesh_local->nPatches);
        }
      }
      return __return_storage_ptr__;
    }
  }
  else {
    std::__throw_system_error(iVar2);
  }
  LogFatal<char_const(&)[18],char_const(&)[8],char_const(&)[18],unsigned_long&,char_const(&)[8],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
             ,0x3d9,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [18])"allMeshes->size()"
             ,(char (*) [8])"1 << 31",(char (*) [18])"allMeshes->size()",&va,(char (*) [8])"1 << 31"
             ,&vb);
}

Assistant:

pstd::vector<ShapeHandle> BilinearPatch::CreatePatches(const BilinearPatchMesh *mesh,
                                                       Allocator alloc) {
    static std::mutex allMeshesLock;
    allMeshesLock.lock();
    CHECK_LT(allMeshes->size(), 1 << 31);
    int meshIndex = int(allMeshes->size());
    allMeshes->push_back(mesh);
    allMeshesLock.unlock();

    pstd::vector<ShapeHandle> blps(mesh->nPatches, alloc);
    BilinearPatch *patches = alloc.allocate_object<BilinearPatch>(mesh->nPatches);
    for (int i = 0; i < mesh->nPatches; ++i) {
        alloc.construct(&patches[i], mesh, meshIndex, i);
        blps[i] = &patches[i];
    }

    return blps;
}